

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                  *this,char code,bool ignore_zero)

{
  CStringRef arg0;
  byte bVar1;
  int iVar2;
  int iVar3;
  NumericExpr NVar4;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *this_00;
  byte in_DL;
  char in_SIL;
  undefined8 *in_RDI;
  double dVar5;
  double value;
  int i;
  CallArgHandler args;
  int num_args;
  int func_index;
  int in_stack_00000064;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_00000068;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  ArgHandler *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffcc;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffec;
  NumericExpr local_4;
  
  bVar1 = in_DL & 1;
  this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
             *)(ulong)((int)in_SIL - 0x66);
  switch(this_00) {
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x0:
    iVar2 = ReadUInt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    iVar3 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      ((BinaryReader<mp::internal::IdentityConverter> *)this_00);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    NLHandler<mp::NullNLHandler<int>,_int>::BeginCall
              ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                        *)CONCAT17(in_SIL,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,iVar2)))
                      );
      NLHandler<mp::NullNLHandler<int>,_int>::ArgHandler::AddArg
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    local_4 = NLHandler<mp::NullNLHandler<int>,_int>::EndCall
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_RDI[2]);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc8,"expected expression");
    arg0.data_._4_4_ = in_stack_ffffffffffffffe4;
    arg0.data_._0_4_ = in_stack_ffffffffffffffe0;
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               arg0);
    goto LAB_0025122a;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x6:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x8:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0xd:
    dVar5 = ReadConstant(in_stack_ffffffffffffffd0,(char)(in_stack_ffffffffffffffcc >> 0x18));
    if ((((bVar1 & 1) == 0) || (dVar5 != 0.0)) || (NAN(dVar5))) {
      NVar4 = NLHandler<mp::NullNLHandler<int>,_int>::OnNumber
                        ((NLHandler<mp::NullNLHandler<int>,_int> *)in_stack_ffffffffffffffb0,
                         (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      return NVar4;
    }
LAB_0025122a:
    local_4 = 0;
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x9:
    ReadOpCode(this_00);
    local_4 = ReadNumericExpr(in_stack_00000068,in_stack_00000064);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
        *)0x10:
    local_4 = DoReadReference(this_00);
  }
  return local_4;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}